

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O0

void Nwk_ManMarkTfiCone_rec(Nwk_Obj_t *pObj)

{
  bool bVar1;
  int local_1c;
  Nwk_Obj_t *pNStack_18;
  int i;
  Nwk_Obj_t *pNext;
  Nwk_Obj_t *pObj_local;
  
  if ((*(uint *)&pObj->field_0x20 >> 4 & 1) == 0) {
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 & 0xffffffef | 0x10;
    local_1c = 0;
    while( true ) {
      bVar1 = false;
      if (local_1c < pObj->nFanins) {
        pNStack_18 = pObj->pFanio[local_1c];
        bVar1 = pNStack_18 != (Nwk_Obj_t *)0x0;
      }
      if (!bVar1) break;
      Nwk_ManMarkTfiCone_rec(pNStack_18);
      local_1c = local_1c + 1;
    }
  }
  return;
}

Assistant:

void Nwk_ManMarkTfiCone_rec( Nwk_Obj_t * pObj )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( pObj->MarkA )
        return;
    pObj->MarkA = 1;
    Nwk_ObjForEachFanin( pObj, pNext, i )
        Nwk_ManMarkTfiCone_rec( pNext );
}